

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBucket::Sweep(LargeHeapBucket *this,RecyclerSweep *recyclerSweep)

{
  undefined4 *puVar1;
  LargeHeapBlock *heapBlockList;
  LargeHeapBlock *heapBlockList_00;
  LargeHeapBlock *heapBlockList_01;
  LargeHeapBlock *heapBlockList_02;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *pRVar5;
  undefined8 *in_FS_OFFSET;
  
  pRVar5 = RecyclerSweep::GetRecycler(recyclerSweep);
  BVar4 = Recycler::IsConcurrentExecutingState(pRVar5);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x251,"(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState())",
                       "!recyclerSweep.GetRecycler()->IsConcurrentExecutingState()");
    if (!bVar3) goto LAB_0024e646;
    *puVar1 = 0;
  }
  heapBlockList = this->fullLargeBlockList;
  heapBlockList_00 = this->largeBlockList;
  heapBlockList_01 = this->largePageHeapBlockList;
  heapBlockList_02 = this->pendingDisposeLargeBlockList;
  this->fullLargeBlockList = (LargeHeapBlock *)0x0;
  this->largeBlockList = (LargeHeapBlock *)0x0;
  this->largePageHeapBlockList = (LargeHeapBlock *)0x0;
  if (this->supportFreeList == true) {
    pRVar5 = RecyclerSweep::GetRecycler(recyclerSweep);
    if (pRVar5->recyclerFlagsTable->Verbose == true) {
      pRVar5 = RecyclerSweep::GetRecycler(recyclerSweep);
      bVar3 = Js::Phases::IsEnabled(&pRVar5->recyclerFlagsTable->Trace,MemoryAllocationPhase);
      if (!bVar3) {
        pRVar5 = RecyclerSweep::GetRecycler(recyclerSweep);
        bVar3 = Js::Phases::IsEnabled(&pRVar5->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase)
        ;
        if (!bVar3) goto LAB_0024e59d;
      }
      Output::Print(L"Resetting free list for 0x%x bucket\n",(ulong)(this->super_HeapBucket).sizeCat
                   );
    }
LAB_0024e59d:
    this->freeList = (LargeHeapBlockFreeList *)0x0;
    this->explicitFreeList = (FreeObject *)0x0;
  }
  if (this->pendingSweepLargeBlockList != (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x26d,"(this->pendingSweepLargeBlockList == nullptr)",
                       "this->pendingSweepLargeBlockList == nullptr");
    if (!bVar3) {
LAB_0024e646:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_00);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_01);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_02);
  return;
}

Assistant:

void
LargeHeapBucket::Sweep(RecyclerSweep& recyclerSweep)
{
#if ENABLE_CONCURRENT_GC
    // CONCURRENT-TODO: large buckets are not swept in the background currently.
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState() && !recyclerSweep.GetRecycler()->IsConcurrentSweepState());
#else
    Assert(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState());
#endif
#endif

    LargeHeapBlock * currentLargeObjectBlocks = largeBlockList;
#ifdef RECYCLER_PAGE_HEAP
    LargeHeapBlock * currentLargePageHeapObjectBlocks = largePageHeapBlockList;
#endif
    LargeHeapBlock * currentFullLargeObjectBlocks = fullLargeBlockList;
    LargeHeapBlock * currentDisposeLargeBlockList = pendingDisposeLargeBlockList;
    this->largeBlockList = nullptr;
#ifdef RECYCLER_PAGE_HEAP
    this->largePageHeapBlockList = nullptr;
#endif
    this->fullLargeBlockList = nullptr;

    // Clear the free list before sweep
    // We'll reconstruct the free list during sweep
    if (this->supportFreeList)
    {
#if DBG
        LargeAllocationVerboseTrace(recyclerSweep.GetRecycler()->GetRecyclerFlagsTable(), _u("Resetting free list for 0x%x bucket\n"), this->sizeCat);
#endif
        this->freeList = nullptr;
        this->explicitFreeList = nullptr;
    }

#if ENABLE_CONCURRENT_GC
    Assert(this->pendingSweepLargeBlockList == nullptr);
#endif
    SweepLargeHeapBlockList(recyclerSweep, currentLargeObjectBlocks);
#ifdef RECYCLER_PAGE_HEAP
    SweepLargeHeapBlockList(recyclerSweep, currentLargePageHeapObjectBlocks);
#endif
    SweepLargeHeapBlockList(recyclerSweep, currentFullLargeObjectBlocks);
    SweepLargeHeapBlockList(recyclerSweep, currentDisposeLargeBlockList);
}